

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O3

bool tcu::anon_unknown_3::verifyMultisampleLineGroupInterpolation
               (Surface *surface,LineSceneSpec *scene,RasterizationArguments *args,TestLog *log)

{
  pointer pSVar1;
  undefined8 *puVar2;
  ostringstream *poVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  Vec4 *pVVar10;
  TextureFormat TVar11;
  RasterizationArguments *pRVar12;
  int i;
  int iVar13;
  int iVar14;
  CoverageType CVar15;
  undefined4 extraout_EAX;
  ostream *poVar16;
  long lVar17;
  Surface *surface_00;
  int iVar18;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  bool bVar19;
  int __fd;
  long lVar20;
  long lVar21;
  long lVar22;
  pointer pSVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  float fVar31;
  float fVar36;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar37 [4];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar42;
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float in_XMM3_Db;
  float in_XMM3_Dc;
  float in_XMM3_Dd;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar54;
  float fVar56;
  float fVar57;
  undefined1 auVar55 [16];
  float fVar58;
  undefined1 auVar59 [16];
  float fVar61;
  undefined1 auVar60 [16];
  float fVar62;
  undefined8 uVar63;
  float fVar69;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar68;
  float fVar70;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar71;
  undefined8 uVar72;
  float fVar74;
  undefined1 auVar73 [16];
  float fVar75;
  float fVar76;
  TriangleSceneSpec triangleScene;
  Vec4 colorStackMax;
  Vec3 valueRangeMax;
  IVec3 formatLimit;
  Surface errorMask;
  IVec2 viewportSize;
  IVec3 pixelNativeColor;
  Vec4 colorStackMin;
  Vector<float,_3> res_13;
  Vector<float,_3> res_12;
  Vector<float,_3> res_10;
  Vector<float,_3> res_8;
  Vector<float,_3> res_9;
  Vector<float,_3> res_11;
  Vector<float,_3> res_6;
  Vector<float,_3> res_4;
  Vector<float,_3> res_5;
  Vector<float,_3> res_7;
  Vector<int,_3> res_2;
  Vector<int,_3> res_3;
  Vector<int,_3> res;
  Vector<int,_3> res_1;
  IVec3 colorMax;
  IVec3 colorMin;
  Vec3 colorMaxF;
  Vec3 colorMinF;
  Vec2 corners [4];
  LineInterpolationRange weights [4];
  int local_62c;
  int local_61c;
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  local_618;
  undefined1 local_5f8 [16];
  undefined1 local_5e8 [4];
  float fStack_5e4;
  TextureFormat TStack_5e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5d8;
  RasterizationArguments *local_5c8;
  undefined1 local_5c0 [8];
  TextureFormat local_5b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5b0;
  string local_5a0;
  Surface *local_580;
  undefined1 local_578 [16];
  undefined8 local_568;
  undefined8 uStack_560;
  Surface local_558;
  IVec2 local_540;
  float local_534;
  float local_530;
  uint local_52c;
  int local_528;
  Vector<int,_3> local_524;
  LogImageSet local_518;
  undefined1 local_4d8 [8];
  float fStack_4d0;
  float fStack_4cc;
  undefined8 local_4c8;
  float fStack_4c0;
  float fStack_4bc;
  Vector<float,_3> local_4b0;
  Vector<float,_3> local_4a0;
  float local_490 [4];
  float local_480 [4];
  float local_470 [4];
  Vector<float,_3> local_460;
  float local_450 [4];
  float local_440 [4];
  float local_430 [4];
  Vector<float,_3> local_420;
  int local_410 [4];
  Vector<int,_3> local_400;
  int local_3f0 [4];
  Vector<int,_3> local_3e0;
  int local_3d0 [6];
  int local_3b8 [3];
  int local_3ac [3];
  Vector<int,_3> local_3a0;
  int local_394 [3];
  string local_388;
  string local_368;
  undefined1 local_348 [8];
  size_type local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  undefined1 local_328 [8];
  Vec2 VStack_320;
  undefined1 local_318 [16];
  _Alloc_hider local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8 [6];
  undefined1 local_298 [16];
  ulong local_288;
  undefined8 uStack_280;
  LineSceneSpec *local_270;
  pointer local_268;
  float local_260 [4];
  float local_250 [4];
  float local_240 [4];
  float local_230 [4];
  float local_220 [4];
  float local_210 [4];
  int local_200 [6];
  undefined1 local_1e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1d8;
  _Alloc_hider _Stack_1c8;
  float local_1c0;
  float fStack_1bc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_1b8 [4];
  ios_base local_170 [264];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_568._0_4_ = surface->m_width;
  local_568._4_4_ = surface->m_height;
  uStack_560 = 0;
  local_5f8 = ZEXT416((uint)scene->lineWidth);
  local_618.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_618.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_618.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5c8 = args;
  std::
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::resize(&local_618,
           (long)(scene->lines).
                 super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(scene->lines).
                 super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5);
  pSVar23 = (scene->lines).
            super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(scene->lines).
                              super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar23) >> 6)) {
    auVar52._0_4_ = (float)(int)local_568;
    auVar52._4_4_ = (float)local_568._4_4_;
    auVar52._8_4_ = (float)(int)uStack_560;
    auVar52._12_4_ = (float)uStack_560._4_4_;
    fVar76 = (float)local_5f8._0_4_ * 0.5;
    auVar38._4_4_ = auVar52._0_4_;
    auVar38._0_4_ = auVar52._4_4_;
    auVar38._8_4_ = auVar52._8_4_;
    auVar38._12_4_ = auVar52._12_4_;
    iVar13 = 1;
    lVar17 = 0;
    fVar42 = (float)DAT_00625830;
    fVar48 = DAT_00625830._4_4_;
    fVar49 = DAT_00625830._8_4_;
    fVar50 = DAT_00625830._12_4_;
    in_XMM3_Db = 0.5;
    in_XMM3_Dc = 0.0;
    in_XMM3_Dd = 0.0;
    lVar20 = 0;
    lVar21 = 0;
    do {
      auVar64._8_8_ = 0;
      auVar64._0_8_ = *(ulong *)((long)pSVar23->positions[0].m_data + lVar17);
      auVar55._8_8_ = 0;
      auVar55._0_8_ = *(ulong *)((long)(pSVar23->positions + 1) + lVar17);
      lVar22 = lVar20 >> 0x20;
      uVar4 = *(undefined4 *)((long)pSVar23->positions[0].m_data + lVar17 + 0xc);
      auVar65._4_4_ = uVar4;
      auVar65._0_4_ = uVar4;
      auVar65._8_4_ = uVar4;
      auVar65._12_4_ = uVar4;
      auVar65 = divps(auVar64,auVar65);
      uVar4 = *(undefined4 *)((long)(pSVar23->positions + 1) + 0xcU + lVar17);
      auVar59._4_4_ = uVar4;
      auVar59._0_4_ = uVar4;
      auVar59._8_4_ = uVar4;
      auVar59._12_4_ = uVar4;
      auVar55 = divps(auVar55,auVar59);
      fVar62 = (auVar65._0_4_ + fVar42) * 0.5 * auVar52._0_4_;
      fVar68 = (auVar65._4_4_ + fVar48) * 0.5 * auVar52._4_4_;
      fVar69 = (auVar65._8_4_ + fVar49) * 0.0 * auVar52._8_4_;
      fVar70 = (auVar65._12_4_ + fVar50) * 0.0 * auVar52._12_4_;
      fVar54 = (auVar55._0_4_ + fVar42) * 0.5 * auVar52._0_4_;
      fVar56 = (auVar55._4_4_ + fVar48) * 0.5 * auVar52._4_4_;
      fVar57 = (auVar55._8_4_ + fVar49) * 0.0 * auVar52._8_4_;
      fVar58 = (auVar55._12_4_ + fVar50) * 0.0 * auVar52._12_4_;
      fVar71 = fVar54 - fVar62;
      fVar74 = fVar56 - fVar68;
      fVar75 = 1.0 / SQRT(fVar74 * fVar74 + fVar71 * fVar71 + 0.0);
      fVar71 = -fVar75 * fVar71 * fVar76;
      fVar74 = fVar75 * fVar74 * fVar76;
      fVar75 = (fVar57 - fVar69) * -0.0 * fVar76;
      fVar61 = (fVar58 - fVar70) * 0.0 * fVar76;
      auVar73._0_4_ = fVar68 + fVar71;
      auVar73._4_4_ = fVar62 + fVar74;
      auVar73._8_4_ = fVar69 + fVar75;
      auVar73._12_4_ = fVar70 + fVar61;
      auVar55 = divps(auVar73,auVar38);
      uVar72 = CONCAT44(auVar55._0_4_ + auVar55._0_4_ + -1.0,auVar55._4_4_ + auVar55._4_4_ + -1.0);
      pSVar1 = local_618.
               super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar22;
      *(undefined8 *)pSVar1->positions[0].m_data = uVar72;
      pSVar1->positions[0].m_data[2] = 0.0;
      pSVar1->positions[0].m_data[3] = 1.0;
      auVar66._0_4_ = fVar62 - fVar74;
      auVar66._4_4_ = fVar68 - fVar71;
      auVar66._8_4_ = fVar69 - fVar75;
      auVar66._12_4_ = fVar70 - fVar61;
      auVar55 = divps(auVar66,auVar52);
      pVVar10 = local_618.
                super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar22].positions;
      *(ulong *)pVVar10[1].m_data =
           CONCAT44(auVar55._4_4_ + auVar55._4_4_ + -1.0,auVar55._0_4_ + auVar55._0_4_ + -1.0);
      pVVar10[1].m_data[2] = 0.0;
      pVVar10[1].m_data[3] = 1.0;
      auVar67._0_4_ = fVar54 - fVar74;
      auVar67._4_4_ = fVar56 - fVar71;
      auVar67._8_4_ = fVar57 - fVar75;
      auVar67._12_4_ = fVar58 - fVar61;
      auVar55 = divps(auVar67,auVar52);
      uVar63 = CONCAT44(auVar55._4_4_ + auVar55._4_4_ + -1.0,auVar55._0_4_ + auVar55._0_4_ + -1.0);
      pVVar10 = local_618.
                super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar22].positions;
      *(undefined8 *)pVVar10[2].m_data = uVar63;
      pVVar10[2].m_data[2] = 0.0;
      pVVar10[2].m_data[3] = 1.0;
      local_618.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar22].sharedEdge[0] = false;
      local_618.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar22].sharedEdge[1] = false;
      local_618.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar22].sharedEdge[2] = true;
      puVar2 = (undefined8 *)
               ((long)((scene->lines).
                       super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                       ._M_impl.super__Vector_impl_data._M_start)->colors[0].m_data + lVar17);
      uVar8 = puVar2[1];
      *(undefined8 *)
       local_618.
       super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
       ._M_impl.super__Vector_impl_data._M_start[lVar22].colors[0].m_data = *puVar2;
      *(undefined8 *)
       (local_618.
        super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar22].colors[0].m_data + 2) = uVar8;
      puVar2 = (undefined8 *)
               ((long)((scene->lines).
                       super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                       ._M_impl.super__Vector_impl_data._M_start)->colors[0].m_data + lVar17);
      uVar8 = puVar2[1];
      *(undefined8 *)
       local_618.
       super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
       ._M_impl.super__Vector_impl_data._M_start[lVar22].colors[1].m_data = *puVar2;
      *(undefined8 *)
       (local_618.
        super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar22].colors[1].m_data + 2) = uVar8;
      puVar2 = (undefined8 *)
               ((long)(((scene->lines).
                        super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                        ._M_impl.super__Vector_impl_data._M_start)->colors + 1) + lVar17);
      uVar8 = puVar2[1];
      *(undefined8 *)
       local_618.
       super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
       ._M_impl.super__Vector_impl_data._M_start[lVar22].colors[2].m_data = *puVar2;
      *(undefined8 *)
       (local_618.
        super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar22].colors[2].m_data + 2) = uVar8;
      pSVar1 = local_618.
               super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
               ._M_impl.super__Vector_impl_data._M_start + iVar13;
      *(undefined8 *)pSVar1->positions[0].m_data = uVar72;
      pSVar1->positions[0].m_data[2] = 0.0;
      pSVar1->positions[0].m_data[3] = 1.0;
      pVVar10 = local_618.
                super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar13].positions;
      *(undefined8 *)pVVar10[1].m_data = uVar63;
      pVVar10[1].m_data[2] = 0.0;
      pVVar10[1].m_data[3] = 1.0;
      auVar60._0_4_ = fVar74 + fVar54;
      auVar60._4_4_ = fVar71 + fVar56;
      auVar60._8_4_ = fVar75 + fVar57;
      auVar60._12_4_ = fVar61 + fVar58;
      auVar55 = divps(auVar60,auVar52);
      pVVar10 = local_618.
                super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar13].positions;
      *(ulong *)pVVar10[2].m_data =
           CONCAT44(auVar55._4_4_ + auVar55._4_4_ + -1.0,auVar55._0_4_ + auVar55._0_4_ + -1.0);
      pVVar10[2].m_data[2] = 0.0;
      pVVar10[2].m_data[3] = 1.0;
      local_618.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar13].sharedEdge[0] = true;
      local_618.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar13].sharedEdge[1] = false;
      local_618.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar13].sharedEdge[2] = false;
      puVar2 = (undefined8 *)
               ((long)((scene->lines).
                       super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                       ._M_impl.super__Vector_impl_data._M_start)->colors[0].m_data + lVar17);
      uVar8 = puVar2[1];
      *(undefined8 *)
       local_618.
       super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
       ._M_impl.super__Vector_impl_data._M_start[iVar13].colors[0].m_data = *puVar2;
      *(undefined8 *)
       (local_618.
        super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
        ._M_impl.super__Vector_impl_data._M_start[iVar13].colors[0].m_data + 2) = uVar8;
      puVar2 = (undefined8 *)
               ((long)(((scene->lines).
                        super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                        ._M_impl.super__Vector_impl_data._M_start)->colors + 1) + lVar17);
      uVar8 = puVar2[1];
      *(undefined8 *)
       local_618.
       super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
       ._M_impl.super__Vector_impl_data._M_start[iVar13].colors[1].m_data = *puVar2;
      *(undefined8 *)
       (local_618.
        super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
        ._M_impl.super__Vector_impl_data._M_start[iVar13].colors[1].m_data + 2) = uVar8;
      puVar2 = (undefined8 *)
               ((long)(((scene->lines).
                        super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                        ._M_impl.super__Vector_impl_data._M_start)->colors + 1) + lVar17);
      uVar8 = puVar2[1];
      *(undefined8 *)
       local_618.
       super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
       ._M_impl.super__Vector_impl_data._M_start[iVar13].colors[2].m_data = *puVar2;
      *(undefined8 *)
       (local_618.
        super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
        ._M_impl.super__Vector_impl_data._M_start[iVar13].colors[2].m_data + 2) = uVar8;
      lVar21 = lVar21 + 1;
      pSVar23 = (scene->lines).
                super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                ._M_impl.super__Vector_impl_data._M_start;
      iVar13 = iVar13 + 2;
      lVar20 = lVar20 + 0x200000000;
      lVar17 = lVar17 + 0x40;
    } while (lVar21 < (int)((ulong)((long)(scene->lines).
                                          super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar23
                                   ) >> 6));
  }
  local_528 = local_5c8->numSamples;
  local_540.m_data[0] = surface->m_width;
  local_540.m_data[1] = surface->m_height;
  uVar27 = local_5c8->subpixelBits;
  Surface::Surface(&local_558,local_540.m_data[0],local_540.m_data[1]);
  local_328._0_4_ = RGBA;
  local_328._4_4_ = UNORM_INT8;
  if ((void *)local_558.m_pixels.m_cap != (void *)0x0) {
    local_558.m_pixels.m_cap = (size_t)local_558.m_pixels.m_ptr;
  }
  PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1e8,(TextureFormat *)local_328,local_558.m_width,
             local_558.m_height,1,(void *)local_558.m_pixels.m_cap);
  local_328._0_4_ = R;
  local_328._4_4_ = SNORM_INT8;
  VStack_320.m_data[0] = 0.0;
  VStack_320.m_data[1] = 1.0;
  local_270 = scene;
  tcu::clear((PixelBufferAccess *)local_1e8,(Vec4 *)local_328);
  poVar3 = (ostringstream *)(local_1e8 + 8);
  local_1e8._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar3,"Verifying rasterization result. Native format is RGB",0x34);
  pRVar12 = local_5c8;
  std::ostream::operator<<(poVar3,local_5c8->redBits);
  std::ostream::operator<<(poVar3,pRVar12->greenBits);
  std::ostream::operator<<(poVar3,pRVar12->blueBits);
  MessageBuilder::operator<<((MessageBuilder *)local_1e8,(EndMessageToken *)&TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_170);
  if (((8 < pRVar12->redBits) || (8 < pRVar12->greenBits)) || (8 < pRVar12->blueBits)) {
    poVar3 = (ostringstream *)(local_1e8 + 8);
    local_1e8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,
               "Warning! More than 8 bits in a color channel, this may produce false negatives.",
               0x4f);
    MessageBuilder::operator<<((MessageBuilder *)local_1e8,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_170);
  }
  if ((int)uVar27 < 0) {
    poVar3 = (ostringstream *)(local_1e8 + 8);
    local_1e8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Invalid subpixel count (",0x18);
    std::ostream::operator<<(poVar3,uVar27);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"), assuming 0",0xd);
    MessageBuilder::operator<<((MessageBuilder *)local_1e8,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_170);
    uVar27 = 0;
  }
  else if (0x10 < uVar27) {
    poVar3 = (ostringstream *)(local_1e8 + 8);
    local_1e8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Subpixel count is greater than 16 (",0x23);
    std::ostream::operator<<(poVar3,uVar27);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,
               "). Checking results using less strict 16 bit requirements. This may produce false positives."
               ,0x5c);
    MessageBuilder::operator<<((MessageBuilder *)local_1e8,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_170);
    uVar27 = 0x10;
  }
  iVar13 = surface->m_height;
  __fd = (int)log;
  if (0 < iVar13) {
    iVar14 = surface->m_width;
    local_62c = 0;
    auVar9._12_4_ = 0;
    auVar9._0_12_ = local_5f8._4_12_;
    local_5f8 = auVar9 << 0x20;
    local_61c = 0;
    local_580 = surface;
    local_52c = uVar27;
    do {
      if (0 < iVar14) {
        local_530 = (float)(int)local_5f8._0_4_;
        local_534 = local_530 + 1.0;
        iVar13 = 0;
        do {
          uVar27 = *(uint *)((long)(surface->m_pixels).m_ptr +
                            (long)(iVar14 * local_5f8._0_4_ + iVar13) * 4);
          local_518.m_name._0_16_ = ZEXT816(0);
          _local_5e8 = (pointer)0x0;
          TStack_5e0.order = R;
          TStack_5e0.type = SNORM_INT8;
          TVar11 = TStack_5e0;
          lVar17 = ((long)local_618.
                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_618.
                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x70a3d70a3d70a3d7;
          local_568 = CONCAT44(local_568._4_4_,iVar13);
          local_288 = CONCAT44(local_288._4_4_,(float)iVar13);
          local_298._0_4_ = (float)iVar13 + 1.0;
          uVar24 = (int)lVar17 - 1;
          if ((int)uVar24 < 0) {
LAB_0060a684:
            convertRGB8ToNativeFormat((anon_unknown_3 *)local_328,(RGBA *)(ulong)uVar27,local_5c8);
            if ((1 < (int)local_328._0_4_) ||
               ((1 < (int)local_328._4_4_ || (1 < (int)VStack_320.m_data[0])))) {
              poVar3 = (ostringstream *)(local_1e8 + 8);
              iVar13 = (int)local_568;
              if (local_62c + 1 < 4) {
                local_1e8._0_8_ = log;
                std::__cxx11::ostringstream::ostringstream(poVar3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar3,"Found an invalid pixel at (",0x1b);
                std::ostream::operator<<(poVar3,iVar13);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,",",1);
                std::ostream::operator<<(poVar3,local_5f8._0_4_);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,")\n",2);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar3,"\tPixel color:\t\t",0xf);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"RGBA(",5);
                poVar16 = (ostream *)std::ostream::operator<<(poVar3,uVar27 & 0xff);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
                poVar16 = (ostream *)std::ostream::operator<<(poVar16,uVar27 >> 8 & 0xff);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
                poVar16 = (ostream *)std::ostream::operator<<(poVar16,uVar27 >> 0x10 & 0xff);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
                poVar16 = (ostream *)std::ostream::operator<<(poVar16,uVar27 >> 0x18);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,")",1);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar3,"\tExpected background color.\n",0x1c);
                MessageBuilder::operator<<
                          ((MessageBuilder *)local_1e8,(EndMessageToken *)&TestLog::EndMessage);
LAB_0060a84d:
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1e8 + 8));
                std::ios_base::~ios_base(local_170);
              }
              goto LAB_0060a869;
            }
LAB_0060a6bb:
            iVar13 = (int)local_568;
          }
          else {
            local_4c8 = local_618.
                        super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            local_268 = (local_270->lines).
                        super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            local_68 = CONCAT44((float)local_540.m_data[1],(float)local_540.m_data[0]);
            uStack_60 = 0;
            local_5e8 = (undefined1  [4])0x0;
            fStack_5e4 = 0.0;
            TStack_5e0.order = R;
            TStack_5e0.type = SNORM_INT8;
            auVar37 = local_5e8;
            fVar42 = fStack_5e4;
            fVar48 = (float)TStack_5e0.order;
            fVar49 = (float)TStack_5e0.type;
            TStack_5e0 = TVar11;
            iVar14 = 0;
            do {
              uVar28 = (int)lVar17 - 2;
              lVar20 = lVar17;
              uVar26 = uVar24;
              _local_58 = (undefined1  [16])local_518.m_name._0_16_;
              local_48 = (float)auVar37;
              fStack_44 = fVar42;
              fStack_40 = fVar48;
              fStack_3c = fVar49;
              while( true ) {
                uVar24 = uVar28;
                lVar20 = lVar20 + -1;
                pSVar1 = local_4c8 + uVar26;
                local_1e8._4_4_ = local_5f8._0_4_;
                local_1e8._0_4_ = (ChannelOrder)local_568;
                CVar15 = calculateTriangleCoverage
                                   (pSVar1->positions,local_4c8[uVar26].positions + 1,
                                    local_4c8[uVar26].positions + 2,(IVec2 *)local_1e8,&local_540,
                                    local_52c,local_528 != 0);
                if (CVar15 < COVERAGE_NONE) break;
                lVar17 = lVar17 + -1;
                uVar26 = (int)lVar17 - 1;
                uVar28 = uVar24 - 1;
                if ((int)uVar24 < 0) goto LAB_00609afb;
              }
              uVar26 = uVar26 >> 1;
              local_328._4_4_ = local_530;
              local_328._0_4_ = (float)local_288;
              VStack_320.m_data[1] = local_534;
              VStack_320.m_data[0] = (float)local_288;
              local_318._0_4_ = local_298._0_4_;
              local_318._4_4_ = local_534;
              local_318._8_4_ = local_298._0_4_;
              local_318._12_4_ = local_530;
              fVar42 = *(float *)((long)local_268[uVar26].positions[0].m_data + 0xc);
              local_578 = ZEXT416((uint)fVar42);
              fVar48 = *(float *)((long)(local_268[uVar26].positions + 1) + 0xc);
              auVar51._8_8_ = 0;
              auVar51._0_8_ = *(ulong *)local_268[uVar26].positions[0].m_data;
              auVar39._4_4_ = fVar42;
              auVar39._0_4_ = fVar42;
              auVar39._8_8_ = 0;
              auVar52 = divps(auVar51,auVar39);
              local_5c0._0_4_ = (auVar52._0_4_ + 1.0) * 0.5 * (float)local_68;
              local_5c0._4_4_ = (auVar52._4_4_ + 1.0) * 0.5 * local_68._4_4_;
              auVar53._8_8_ = 0;
              auVar53._0_8_ = *(ulong *)local_268[uVar26].positions[1].m_data;
              _local_4d8 = ZEXT416((uint)fVar48);
              auVar40._4_4_ = fVar48;
              auVar40._0_4_ = fVar48;
              auVar40._8_8_ = 0;
              auVar52 = divps(auVar53,auVar40);
              local_5a0._M_dataplus._M_p =
                   (pointer)CONCAT44((auVar52._4_4_ + 1.0) * 0.5 * local_68._4_4_,
                                     (auVar52._0_4_ + 1.0) * 0.5 * (float)local_68);
              calcLineInterpolationWeights
                        ((anon_unknown_3 *)local_1e8,(Vec2 *)local_5c0,fVar42,(Vec2 *)&local_5a0,
                         fVar48,(Vec2 *)local_328);
              calcLineInterpolationWeights
                        ((anon_unknown_3 *)(local_1e8 + 0x10),(Vec2 *)local_5c0,
                         (float)local_578._0_4_,(Vec2 *)&local_5a0,(float)local_4d8._0_4_,
                         &VStack_320);
              calcLineInterpolationWeights
                        ((anon_unknown_3 *)&_Stack_1c8,(Vec2 *)local_5c0,(float)local_578._0_4_,
                         (Vec2 *)&local_5a0,(float)local_4d8._0_4_,(Vec2 *)local_318);
              calcLineInterpolationWeights
                        ((anon_unknown_3 *)aaStack_1b8[0]._M_local_buf,(Vec2 *)local_5c0,
                         (float)local_578._0_4_,(Vec2 *)&local_5a0,(float)local_4d8._0_4_,
                         (Vec2 *)(local_318 + 8));
              fVar42 = (float)((ulong)aaStack_1b8[0]._8_8_ >> 0x20);
              uVar26 = -(uint)(local_1c0 <= (float)aaStack_1b8[0]._8_8_);
              uVar28 = -(uint)(fStack_1bc <= fVar42);
              uVar29 = -(uint)((float)aStack_1d8._M_allocated_capacity._0_4_ <=
                              (float)local_1e8._0_8_);
              uVar30 = -(uint)((float)aStack_1d8._M_allocated_capacity._4_4_ <=
                              SUB84(local_1e8._0_8_,4));
              auVar32._0_8_ =
                   CONCAT44(-(uint)(SUB84(local_1e8._8_8_,4) <=
                                   (float)((ulong)aStack_1d8._8_8_ >> 0x20)),
                            -(uint)((float)local_1e8._8_8_ <= (float)aStack_1d8._8_8_));
              auVar32._8_4_ =
                   -(uint)((float)aaStack_1b8[0]._M_allocated_capacity <= SUB84(_Stack_1c8._M_p,0));
              auVar32._12_4_ =
                   -(uint)((float)((ulong)aaStack_1b8[0]._0_8_ >> 0x20) <=
                          (float)((ulong)_Stack_1c8._M_p >> 0x20));
              auVar43._0_4_ = (uint)local_1c0 & uVar26;
              auVar43._4_4_ = (uint)fStack_1bc & uVar28;
              auVar43._8_4_ = (uint)(float)local_1e8._0_8_ & uVar29;
              auVar43._12_4_ = (uint)SUB84(local_1e8._0_8_,4) & uVar30;
              auVar41._0_4_ = ~uVar26 & (uint)(float)aaStack_1b8[0]._8_8_;
              auVar41._4_4_ = ~uVar28 & (uint)fVar42;
              auVar41._8_4_ = ~uVar29 & aStack_1d8._M_allocated_capacity._0_4_;
              auVar41._12_4_ = ~uVar30 & aStack_1d8._M_allocated_capacity._4_4_;
              auVar41 = auVar41 | auVar43;
              uVar7 = (ulong)_Stack_1c8._M_p & auVar32._8_8_;
              auVar33._0_8_ = ~auVar32._0_8_ & aStack_1d8._8_8_;
              auVar33._8_8_ = ~auVar32._8_8_ & aaStack_1b8[0]._M_allocated_capacity;
              auVar6._8_4_ = (int)uVar7;
              auVar6._0_8_ = local_1e8._8_8_ & auVar32._0_8_;
              auVar6._12_4_ = (int)(uVar7 >> 0x20);
              auVar33 = auVar33 | auVar6;
              auVar44._0_8_ =
                   CONCAT44(-(uint)(auVar33._4_4_ <= auVar41._4_4_),
                            -(uint)(auVar33._0_4_ <= auVar41._0_4_));
              auVar44._8_4_ = -(uint)(auVar33._8_4_ <= auVar41._8_4_);
              auVar44._12_4_ = -(uint)(auVar33._12_4_ <= auVar41._12_4_);
              auVar34._0_8_ = auVar33._0_8_ & auVar44._0_8_;
              auVar34._8_8_ = auVar41._8_8_ & auVar44._8_8_;
              auVar45._0_8_ = ~auVar44._0_8_ & auVar41._0_8_;
              auVar45._8_8_ = ~auVar44._8_8_ & auVar33._8_8_;
              auVar45 = auVar45 | auVar34;
              fVar42 = auVar45._0_4_;
              fVar48 = auVar45._4_4_;
              fVar50 = auVar45._8_4_;
              fVar76 = auVar45._12_4_;
              auVar35._4_4_ = -(uint)(fVar48 < 0.0);
              auVar35._0_4_ = -(uint)(fVar42 < 0.0);
              auVar35._8_4_ = -(uint)(fVar50 < 0.0);
              auVar35._12_4_ = -(uint)(fVar76 < 0.0);
              uVar26 = movmskps(extraout_EAX,auVar35);
              fVar49 = 0.0;
              if (((uVar26 & 4) == 0) && (fVar49 = 1.0, fVar50 <= 1.0)) {
                fVar49 = fVar50;
              }
              fVar50 = pSVar1->colors[0].m_data[0];
              fVar54 = pSVar1->colors[0].m_data[1];
              fVar56 = pSVar1->colors[0].m_data[2];
              fVar57 = pSVar1->colors[0].m_data[3];
              fVar58 = pSVar1->colors[2].m_data[0];
              in_XMM3_Db = pSVar1->colors[2].m_data[1];
              in_XMM3_Dc = pSVar1->colors[2].m_data[2];
              in_XMM3_Dd = pSVar1->colors[2].m_data[3];
              fVar71 = 0.0;
              if (((uVar26 & 8) == 0) && (fVar71 = 1.0, fVar76 <= 1.0)) {
                fVar71 = fVar76;
              }
              fVar76 = 0.0;
              if (((uVar26 & 1) == 0) && (fVar76 = 1.0, fVar42 <= 1.0)) {
                fVar76 = fVar42;
              }
              fVar74 = 0.0;
              if (((uVar26 & 2) == 0) && (fVar74 = 1.0, fVar48 <= 1.0)) {
                fVar74 = fVar48;
              }
              fVar75 = pSVar1->colors[1].m_data[0] * 0.0;
              fVar61 = pSVar1->colors[1].m_data[1] * 0.0;
              fVar62 = pSVar1->colors[1].m_data[2] * 0.0;
              fVar68 = pSVar1->colors[1].m_data[3] * 0.0;
              auVar37 = (undefined1  [4])(fVar71 * fVar58 + fVar49 * fVar50 + fVar75);
              fVar42 = fVar71 * in_XMM3_Db + fVar49 * fVar54 + fVar61;
              fVar48 = fVar71 * in_XMM3_Dc + fVar49 * fVar56 + fVar62;
              fVar49 = fVar71 * in_XMM3_Dd + fVar49 * fVar57 + fVar68;
              fVar31 = fVar74 * fVar58 + fVar76 * fVar50 + fVar75;
              fVar36 = fVar74 * in_XMM3_Db + fVar76 * fVar54 + fVar61;
              auVar47._0_8_ = CONCAT44(fVar36,fVar31);
              auVar47._8_4_ = fVar74 * in_XMM3_Dc + fVar76 * fVar56 + fVar62;
              auVar47._12_4_ = fVar74 * in_XMM3_Dd + fVar76 * fVar57 + fVar68;
              iVar13 = iVar14 + 1;
              if (iVar14 == 0) {
                local_518.m_name._M_dataplus._M_p = (pointer)auVar47._0_8_;
                local_518.m_name._M_string_length = auVar47._8_8_;
                fStack_5e4 = fVar42;
                local_5e8 = auVar37;
                TStack_5e0.type = (ChannelType)fVar49;
                TStack_5e0.order = (ChannelOrder)fVar48;
                if (CVar15 == COVERAGE_FULL) {
                  iVar14 = 0;
                  goto LAB_00609b25;
                }
              }
              else {
                auVar46._0_4_ = ~-(uint)((float)local_58._0_4_ <= fVar31) & (uint)fVar31;
                auVar46._4_4_ = ~-(uint)((float)local_58._4_4_ <= fVar36) & (uint)fVar36;
                auVar46._8_4_ = ~-(uint)(fStack_50 <= auVar47._8_4_) & (uint)auVar47._8_4_;
                auVar46._12_4_ = ~-(uint)(fStack_4c <= auVar47._12_4_) & (uint)auVar47._12_4_;
                auVar5._4_4_ = local_58._4_4_ & -(uint)((float)local_58._4_4_ <= fVar36);
                auVar5._0_4_ = local_58._0_4_ & -(uint)((float)local_58._0_4_ <= fVar31);
                auVar5._8_4_ = (uint)fStack_50 & -(uint)(fStack_50 <= auVar47._8_4_);
                auVar5._12_4_ = (uint)fStack_4c & -(uint)(fStack_4c <= auVar47._12_4_);
                auVar47 = auVar46 | auVar5;
                local_518.m_name._M_dataplus._M_p = (pointer)auVar47._0_8_;
                local_518.m_name._M_string_length = auVar47._8_8_;
                in_XMM3_Db = (float)((uint)fStack_44 & -(uint)(fVar42 <= fStack_44));
                in_XMM3_Dc = (float)((uint)fStack_40 & -(uint)(fVar48 <= fStack_40));
                in_XMM3_Dd = (float)((uint)fStack_3c & -(uint)(fVar49 <= fStack_3c));
                auVar37 = (undefined1  [4])
                          (~-(uint)((float)auVar37 <= local_48) & (uint)auVar37 |
                          (uint)local_48 & -(uint)((float)auVar37 <= local_48));
                fVar42 = (float)(~-(uint)(fVar42 <= fStack_44) & (uint)fVar42 | (uint)in_XMM3_Db);
                fVar48 = (float)(~-(uint)(fVar48 <= fStack_40) & (uint)fVar48 | (uint)in_XMM3_Dc);
                fVar49 = (float)(~-(uint)(fVar49 <= fStack_3c) & (uint)fVar49 | (uint)in_XMM3_Dd);
                fStack_5e4 = fVar42;
                local_5e8 = auVar37;
                TStack_5e0.type = (ChannelType)fVar49;
                TStack_5e0.order = (ChannelOrder)fVar48;
                if (CVar15 == COVERAGE_FULL) {
                  surface = local_580;
                  if (iVar13 != 0) goto LAB_00609b25;
                  goto LAB_0060a684;
                }
              }
              lVar17 = lVar20;
              local_518.m_name._0_16_ = auVar47;
              iVar14 = iVar13;
            } while (-1 < (int)uVar24);
LAB_00609afb:
            surface = local_580;
            if ((iVar14 == 0) ||
               (local_518.m_name._0_16_ = ZEXT816(0x3f80000000000000) << 0x40, iVar14 == -1))
            goto LAB_0060a684;
LAB_00609b25:
            local_1e8._0_8_ = &local_518;
            local_1e8._8_8_ = 0x100000000;
            aStack_1d8._M_allocated_capacity._0_4_ = 2;
            local_328._0_4_ = R;
            local_328._4_4_ = SNORM_INT8;
            VStack_320.m_data = VStack_320.m_data & 0xffffffff00000000;
            lVar17 = 2;
            do {
              *(undefined4 *)(local_328 + lVar17 * 4 + -8) =
                   *(undefined4 *)((long)&local_518 + (long)*(int *)(local_1e8 + lVar17 * 4) * 4);
              lVar17 = lVar17 + 1;
            } while (lVar17 != 5);
            local_1e8._0_8_ = local_5e8;
            local_1e8._8_8_ = 0x100000000;
            aStack_1d8._M_allocated_capacity._0_4_ = 2.8026e-45;
            local_5c0._0_4_ = 0.0;
            local_5c0._4_4_ = 0.0;
            local_5b8 = (TextureFormat)((ulong)local_5b8 & 0xffffffff00000000);
            lVar17 = 2;
            do {
              *(undefined4 *)((long)&local_5c8 + lVar17 * 4) =
                   *(undefined4 *)(local_5e8 + (long)*(int *)(local_1e8 + lVar17 * 4) * 4);
              lVar17 = lVar17 + 1;
            } while (lVar17 != 5);
            local_5a0._M_dataplus._M_p._0_4_ = ~(-1 << ((byte)local_5c8->redBits & 0x1f));
            local_5a0._M_dataplus._M_p._4_4_ = ~(-1 << ((byte)local_5c8->greenBits & 0x1f));
            uVar24 = ~(-1 << ((byte)local_5c8->blueBits & 0x1f));
            local_5a0._M_string_length = CONCAT44(local_5a0._M_string_length._4_4_,uVar24);
            fVar42 = (float)(int)(uint)local_5a0._M_dataplus._M_p;
            fVar48 = (float)local_328._0_4_ * fVar42;
            local_348._0_4_ = fVar42;
            if (fVar48 <= fVar42) {
              local_348._0_4_ = fVar48;
            }
            local_348._0_4_ = ~-(uint)(fVar48 < 0.0) & local_348._0_4_;
            fVar48 = (float)(int)local_5a0._M_dataplus._M_p._4_4_;
            fVar50 = (float)local_328._4_4_ * fVar48;
            fVar49 = fVar48;
            if (fVar50 <= fVar48) {
              fVar49 = fVar50;
            }
            fVar76 = (float)(int)uVar24;
            local_348._4_4_ = ~-(uint)(fVar50 < 0.0) & (uint)fVar49;
            local_578 = ZEXT416((uint)local_348._4_4_);
            fVar49 = VStack_320.m_data[0] * fVar76;
            local_4c8._0_4_ = fVar76;
            if (fVar49 <= fVar76) {
              local_4c8._0_4_ = fVar49;
            }
            local_4c8._0_4_ = (float)(~-(uint)(fVar49 < 0.0) & (uint)(float)local_4c8);
            local_340 = CONCAT44(local_340._4_4_,(float)local_4c8);
            fVar49 = (float)local_5c0._0_4_ * fVar42;
            if (fVar49 <= fVar42) {
              fVar42 = fVar49;
            }
            local_368._M_dataplus._M_p._0_4_ = ~-(uint)(fVar49 < 0.0) & (uint)fVar42;
            local_298 = ZEXT416((uint)local_368._M_dataplus._M_p);
            fVar42 = (float)local_5c0._4_4_ * fVar48;
            if (fVar42 <= fVar48) {
              fVar48 = fVar42;
            }
            local_368._M_dataplus._M_p._4_4_ = ~-(uint)(fVar42 < 0.0) & (uint)fVar48;
            local_288 = (ulong)local_368._M_dataplus._M_p._4_4_;
            uStack_280 = 0;
            fVar42 = (float)local_5b8.order * fVar76;
            if (fVar42 <= fVar76) {
              fVar76 = fVar42;
            }
            local_4d8._0_4_ = ~-(uint)(fVar42 < 0.0) & (uint)fVar76;
            local_4d8._4_4_ = in_XMM3_Db;
            fStack_4d0 = in_XMM3_Dc;
            fStack_4cc = in_XMM3_Dd;
            local_368._M_string_length = CONCAT44(local_368._M_string_length._4_4_,local_4d8._0_4_);
            fStack_4c0 = in_XMM3_Dc;
            fStack_4bc = in_XMM3_Dd;
            local_4c8._4_4_ = in_XMM3_Db;
            fVar42 = floorf((float)local_348._0_4_);
            fVar48 = floorf((float)local_578._0_4_);
            local_578._0_4_ = fVar48;
            fVar48 = floorf((float)local_4c8);
            iVar13 = (int)(float)local_578._0_4_;
            local_388._M_dataplus._M_p._4_4_ = iVar13;
            local_388._M_dataplus._M_p._0_4_ = (int)fVar42;
            local_388._M_string_length = CONCAT44(local_388._M_string_length._4_4_,(int)fVar48);
            fVar49 = ceilf((float)local_298._0_4_);
            fVar50 = ceilf((float)local_288);
            local_4c8 = (pointer)CONCAT44(local_4c8._4_4_,fVar50);
            fVar50 = ceilf((float)local_4d8._0_4_);
            iVar25 = (int)(float)local_4c8;
            local_394[0] = (int)fVar49;
            local_394[1] = iVar25;
            local_394[2] = (int)fVar50;
            convertRGB8ToNativeFormat((anon_unknown_3 *)&local_524,(RGBA *)(ulong)uVar27,local_5c8);
            surface = local_580;
            if ((((((int)fVar42 - iVar14 <= local_524.m_data[0]) &&
                  (iVar13 - iVar14 <= local_524.m_data[1])) &&
                 ((int)fVar48 - iVar14 <= local_524.m_data[2])) &&
                ((local_524.m_data[0] <= (int)fVar49 + iVar14 &&
                 (local_524.m_data[1] <= iVar25 + iVar14)))) &&
               (local_524.m_data[2] <= (int)fVar50 + iVar14)) goto LAB_0060a6bb;
            poVar3 = (ostringstream *)(local_1e8 + 8);
            iVar13 = (int)local_568;
            if (local_62c + 1 < 5) {
              local_1e8._0_8_ = log;
              std::__cxx11::ostringstream::ostringstream(poVar3);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar3,"Found an invalid pixel at (",0x1b);
              std::ostream::operator<<(poVar3,iVar13);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,",",1);
              std::ostream::operator<<(poVar3,local_5f8._0_4_);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,")\n",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar3,"\tPixel color:\t\t",0xf);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"RGBA(",5);
              poVar16 = (ostream *)std::ostream::operator<<(poVar3,uVar27 & 0xff);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
              poVar16 = (ostream *)std::ostream::operator<<(poVar16,uVar27 >> 8 & 0xff);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
              poVar16 = (ostream *)std::ostream::operator<<(poVar16,uVar27 >> 0x10 & 0xff);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
              poVar16 = (ostream *)std::ostream::operator<<(poVar16,uVar27 >> 0x18);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,")",1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar3,"\tNative color:\t\t",0x10);
              tcu::operator<<((ostream *)poVar3,&local_524);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar3,"\tAllowed error:\t\t",0x11);
              local_3a0.m_data[0] = iVar14;
              local_3a0.m_data[1] = iVar14;
              local_3a0.m_data[2] = iVar14;
              tcu::operator<<((ostream *)poVar3,&local_3a0);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar3,"\tReference native color min: ",0x1d);
              local_3ac[0] = iVar14;
              local_3ac[1] = iVar14;
              local_3ac[2] = iVar14;
              local_3f0[0] = 0;
              local_3f0[1] = 0;
              local_3f0[2] = 0;
              lVar17 = 0;
              do {
                local_3f0[lVar17] =
                     *(int *)((long)&local_388._M_dataplus._M_p + lVar17 * 4) -
                     local_3d0[lVar17 + 9];
                lVar17 = lVar17 + 1;
              } while (lVar17 != 3);
              local_200[3] = 0;
              local_200[4] = 0;
              local_200[5] = 0;
              local_3e0.m_data[2] = 0;
              local_3e0.m_data[0] = 0;
              local_3e0.m_data[1] = 0;
              lVar17 = 0;
              do {
                iVar25 = local_3f0[lVar17];
                iVar18 = *(int *)((long)&local_5a0._M_dataplus._M_p + lVar17 * 4);
                if (iVar25 < iVar18) {
                  iVar18 = iVar25;
                }
                if (iVar25 < local_200[lVar17 + 3]) {
                  iVar18 = local_200[lVar17 + 3];
                }
                local_3e0.m_data[lVar17] = iVar18;
                lVar17 = lVar17 + 1;
              } while (lVar17 != 3);
              tcu::operator<<((ostream *)poVar3,&local_3e0);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar3,"\tReference native color max: ",0x1d);
              local_3b8[0] = iVar14;
              local_3b8[1] = iVar14;
              local_3b8[2] = iVar14;
              local_410[0] = 0;
              local_410[1] = 0;
              local_410[2] = 0;
              lVar17 = 0;
              do {
                local_410[lVar17] = local_3d0[lVar17 + 6] + local_394[lVar17];
                lVar17 = lVar17 + 1;
              } while (lVar17 != 3);
              local_200[0] = 0;
              local_200[1] = 0;
              local_200[2] = 0;
              local_400.m_data[2] = 0;
              local_400.m_data[0] = 0;
              local_400.m_data[1] = 0;
              lVar17 = 0;
              do {
                iVar25 = local_410[lVar17];
                iVar18 = *(int *)((long)&local_5a0._M_dataplus._M_p + lVar17 * 4);
                if (iVar25 < iVar18) {
                  iVar18 = iVar25;
                }
                if (iVar25 < local_200[lVar17]) {
                  iVar18 = local_200[lVar17];
                }
                local_400.m_data[lVar17] = iVar18;
                lVar17 = lVar17 + 1;
              } while (lVar17 != 3);
              tcu::operator<<((ostream *)poVar3,&local_400);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar3,"\tReference native float min: ",0x1d);
              local_3d0[3] = iVar14;
              local_3d0[4] = iVar14;
              local_3d0[5] = iVar14;
              local_440[0] = 0.0;
              local_440[1] = 0.0;
              local_440[2] = 0.0;
              lVar17 = 0;
              do {
                local_440[lVar17] = (float)local_3d0[lVar17 + 3];
                lVar17 = lVar17 + 1;
              } while (lVar17 != 3);
              local_430[2] = 0.0;
              local_430[0] = 0.0;
              local_430[1] = 0.0;
              lVar17 = 0;
              do {
                local_430[lVar17] = *(float *)(local_348 + lVar17 * 4) - local_440[lVar17];
                lVar17 = lVar17 + 1;
              } while (lVar17 != 3);
              local_210[0] = 0.0;
              local_210[1] = 0.0;
              local_210[2] = 0.0;
              local_450[2] = 0.0;
              local_450[0] = 0.0;
              local_450[1] = 0.0;
              lVar17 = 0;
              do {
                local_450[lVar17] = (float)*(int *)((long)&local_5a0._M_dataplus._M_p + lVar17 * 4);
                lVar17 = lVar17 + 1;
              } while (lVar17 != 3);
              local_420.m_data[2] = 0.0;
              local_420.m_data[0] = 0.0;
              local_420.m_data[1] = 0.0;
              lVar17 = 0;
              do {
                fVar42 = local_430[lVar17];
                fVar48 = local_450[lVar17];
                if (fVar42 <= local_450[lVar17]) {
                  fVar48 = fVar42;
                }
                uVar27 = -(uint)(fVar42 < local_210[lVar17]);
                local_420.m_data[lVar17] =
                     (float)(uVar27 & (uint)local_210[lVar17] | ~uVar27 & (uint)fVar48);
                lVar17 = lVar17 + 1;
              } while (lVar17 != 3);
              tcu::operator<<((ostream *)poVar3,&local_420);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar3,"\tReference native float max: ",0x1d);
              local_3d0[0] = iVar14;
              local_3d0[1] = iVar14;
              local_3d0[2] = iVar14;
              local_480[0] = 0.0;
              local_480[1] = 0.0;
              local_480[2] = 0.0;
              lVar17 = 0;
              do {
                local_480[lVar17] = (float)local_3d0[lVar17];
                lVar17 = lVar17 + 1;
              } while (lVar17 != 3);
              local_470[2] = 0.0;
              local_470[0] = 0.0;
              local_470[1] = 0.0;
              lVar17 = 0;
              do {
                local_470[lVar17] =
                     *(float *)((long)&local_368._M_dataplus._M_p + lVar17 * 4) + local_480[lVar17];
                lVar17 = lVar17 + 1;
              } while (lVar17 != 3);
              local_220[0] = 0.0;
              local_220[1] = 0.0;
              local_220[2] = 0.0;
              local_490[2] = 0.0;
              local_490[0] = 0.0;
              local_490[1] = 0.0;
              lVar17 = 0;
              do {
                local_490[lVar17] = (float)*(int *)((long)&local_5a0._M_dataplus._M_p + lVar17 * 4);
                lVar17 = lVar17 + 1;
              } while (lVar17 != 3);
              local_460.m_data[2] = 0.0;
              local_460.m_data[0] = 0.0;
              local_460.m_data[1] = 0.0;
              lVar17 = 0;
              do {
                fVar42 = local_470[lVar17];
                fVar48 = local_490[lVar17];
                if (fVar42 <= local_490[lVar17]) {
                  fVar48 = fVar42;
                }
                uVar27 = -(uint)(fVar42 < local_220[lVar17]);
                local_460.m_data[lVar17] =
                     (float)(uVar27 & (uint)local_220[lVar17] | ~uVar27 & (uint)fVar48);
                lVar17 = lVar17 + 1;
              } while (lVar17 != 3);
              tcu::operator<<((ostream *)poVar3,&local_460);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\tFmin:\t",7);
              local_230[0] = 0.0;
              local_230[1] = 0.0;
              local_230[2] = 0.0;
              local_240[0] = 1.0;
              local_240[1] = 1.0;
              local_240[2] = 1.0;
              local_4a0.m_data[2] = 0.0;
              local_4a0.m_data[0] = 0.0;
              local_4a0.m_data[1] = 0.0;
              lVar17 = 0;
              do {
                fVar42 = *(float *)(local_328 + lVar17 * 4);
                fVar48 = local_240[lVar17];
                if (fVar42 <= local_240[lVar17]) {
                  fVar48 = fVar42;
                }
                uVar27 = -(uint)(fVar42 < local_230[lVar17]);
                local_4a0.m_data[lVar17] =
                     (float)(uVar27 & (uint)local_230[lVar17] | ~uVar27 & (uint)fVar48);
                lVar17 = lVar17 + 1;
              } while (lVar17 != 3);
              tcu::operator<<((ostream *)poVar3,&local_4a0);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\tFmax:\t",7);
              local_250[0] = 0.0;
              local_250[1] = 0.0;
              local_250[2] = 0.0;
              local_260[0] = 1.0;
              local_260[1] = 1.0;
              local_260[2] = 1.0;
              local_4b0.m_data[2] = 0.0;
              local_4b0.m_data[0] = 0.0;
              local_4b0.m_data[1] = 0.0;
              lVar17 = 0;
              do {
                fVar42 = *(float *)(local_5c0 + lVar17 * 4);
                fVar48 = local_260[lVar17];
                if (fVar42 <= local_260[lVar17]) {
                  fVar48 = fVar42;
                }
                uVar27 = -(uint)(fVar42 < local_250[lVar17]);
                in_XMM3_Db = 0.0;
                in_XMM3_Dc = 0.0;
                in_XMM3_Dd = 0.0;
                local_4b0.m_data[lVar17] =
                     (float)(uVar27 & (uint)local_250[lVar17] | ~uVar27 & (uint)fVar48);
                lVar17 = lVar17 + 1;
              } while (lVar17 != 3);
              tcu::operator<<((ostream *)poVar3,&local_4b0);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
              MessageBuilder::operator<<
                        ((MessageBuilder *)local_1e8,(EndMessageToken *)&TestLog::EndMessage);
              goto LAB_0060a84d;
            }
LAB_0060a869:
            local_62c = local_62c + 1;
            local_61c = local_61c + 1;
            *(undefined4 *)
             ((long)local_558.m_pixels.m_ptr +
             (long)(local_558.m_width * local_5f8._0_4_ + iVar13) * 4) = 0xff0000ff;
          }
          iVar13 = iVar13 + 1;
          iVar14 = surface->m_width;
        } while (iVar13 < iVar14);
        iVar13 = surface->m_height;
      }
      iVar25 = local_5f8._0_4_ + 1;
      local_5f8._0_4_ = iVar25;
    } while (iVar25 < iVar13);
    if (4 < local_62c) {
      poVar3 = (ostringstream *)(local_1e8 + 8);
      local_1e8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Omitted ",8);
      std::ostream::operator<<(poVar3,local_62c + -4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar3," pixel error description(s).",0x1c);
      MessageBuilder::operator<<
                ((MessageBuilder *)local_1e8,(EndMessageToken *)&TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar3);
      std::ios_base::~ios_base(local_170);
    }
    if (local_61c != 0) {
      poVar3 = (ostringstream *)(local_1e8 + 8);
      local_1e8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::ostream::operator<<(poVar3,local_61c);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar3," invalid pixel(s) found.",0x18);
      MessageBuilder::operator<<
                ((MessageBuilder *)local_1e8,(EndMessageToken *)&TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar3);
      std::ios_base::~ios_base(local_170);
      local_1e8._0_4_ = S;
      local_1e8._4_4_ = SNORM_INT8;
      _local_5e8 = (pointer)&local_5d8;
      _local_5e8 = (pointer)std::__cxx11::string::_M_create((ulong *)local_5e8,(ulong)local_1e8);
      local_5d8._M_allocated_capacity = local_1e8._0_8_;
      *(undefined8 *)_local_5e8 = 0x6163696669726556;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_local_5e8 + 8) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_local_5e8 + 9) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_local_5e8 + 10) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_local_5e8 + 0xb) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_local_5e8 + 0xc) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_local_5e8 + 0xd) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_local_5e8 + 0xe) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_local_5e8 + 0xf) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_local_5e8 + 0xf) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_local_5e8 + 0x10) = 'u';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_local_5e8 + 0x11) = 'l';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_local_5e8 + 0x12) = 't';
      TStack_5e0.order = local_1e8._0_4_;
      TStack_5e0.type = local_1e8._4_4_;
      _local_5e8[local_1e8._0_8_] = '\0';
      local_5c0 = (undefined1  [8])&local_5b0;
      local_1e8._0_4_ = S;
      local_1e8._4_4_ = SNORM_INT8;
      local_5c0 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_5c0,(ulong)local_1e8);
      local_5b0._M_allocated_capacity = local_1e8._0_8_;
      *(undefined8 *)local_5c0 = 0x6f20746c75736552;
      builtin_strncpy((char *)((long)local_5c0 + 8),"f render",8);
      builtin_strncpy((char *)((long)local_5c0 + 0xf),"ring",4);
      local_5b8.order = local_1e8._0_4_;
      local_5b8.type = local_1e8._4_4_;
      *(char *)((long)local_5c0 + local_1e8._0_8_) = '\0';
      LogImageSet::LogImageSet(&local_518,(string *)local_5e8,(string *)local_5c0);
      TestLog::startImageSet
                (log,local_518.m_name._M_dataplus._M_p,local_518.m_description._M_dataplus._M_p);
      local_5a0.field_2._M_allocated_capacity._0_4_ = 0x75736552;
      local_5a0.field_2._M_allocated_capacity._4_2_ = 0x746c;
      local_5a0._M_string_length = 6;
      local_5a0.field_2._M_local_buf[6] = '\0';
      local_338._M_allocated_capacity._0_4_ = 0x75736552;
      local_338._M_allocated_capacity._4_2_ = 0x746c;
      local_340 = 6;
      local_338._M_local_buf[6] = '\0';
      local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
      local_348 = (undefined1  [8])&local_338;
      LogImage::LogImage((LogImage *)local_1e8,&local_5a0,(string *)local_348,surface,
                         QP_IMAGE_COMPRESSION_MODE_BEST);
      LogImage::write((LogImage *)local_1e8,__fd,__buf,(size_t)surface);
      local_368.field_2._M_allocated_capacity = 0x73614d726f727245;
      local_368.field_2._8_2_ = 0x6b;
      local_368._M_string_length = 9;
      local_388.field_2._M_allocated_capacity = 0x73614d726f727245;
      local_388.field_2._8_2_ = 0x6b;
      local_388._M_string_length = 9;
      surface_00 = &local_558;
      local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
      local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
      LogImage::LogImage((LogImage *)local_328,&local_368,&local_388,surface_00,
                         QP_IMAGE_COMPRESSION_MODE_BEST);
      LogImage::write((LogImage *)local_328,__fd,__buf_00,(size_t)surface_00);
      TestLog::endImageSet(log);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_p != local_2f8) {
        operator_delete(local_308._M_p,local_2f8[0]._M_allocated_capacity + 1);
      }
      if (local_328 != (undefined1  [8])local_318) {
        operator_delete((void *)local_328,CONCAT44(local_318._4_4_,local_318._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != &local_388.field_2) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_dataplus._M_p != &local_368.field_2) {
        operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Stack_1c8._M_p != aaStack_1b8) {
        operator_delete(_Stack_1c8._M_p,aaStack_1b8[0]._M_allocated_capacity + 1);
      }
      if (local_1e8._0_8_ != (long)local_1e8 + 0x10) {
        operator_delete((void *)local_1e8._0_8_,
                        CONCAT44(aStack_1d8._M_allocated_capacity._4_4_,
                                 aStack_1d8._M_allocated_capacity._0_4_) + 1);
      }
      if (local_348 != (undefined1  [8])&local_338) {
        operator_delete((void *)local_348,
                        CONCAT17(local_338._M_local_buf[7],
                                 CONCAT16(local_338._M_local_buf[6],
                                          CONCAT24(local_338._M_allocated_capacity._4_2_,
                                                   local_338._M_allocated_capacity._0_4_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
        operator_delete(local_5a0._M_dataplus._M_p,
                        CONCAT17(local_5a0.field_2._M_local_buf[7],
                                 CONCAT16(local_5a0.field_2._M_local_buf[6],
                                          CONCAT24(local_5a0.field_2._M_allocated_capacity._4_2_,
                                                   local_5a0.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      if (local_518.m_description._M_dataplus._M_p != (pointer)((long)&local_518 + 0x30U)) {
        operator_delete(local_518.m_description._M_dataplus._M_p,
                        local_518.m_description.field_2._M_allocated_capacity + 1);
      }
      if (local_518.m_name._M_dataplus._M_p != (undefined1 *)((long)&local_518 + 0x10U)) {
        operator_delete(local_518.m_name._M_dataplus._M_p,
                        local_518.m_name.field_2._M_allocated_capacity + 1);
      }
      if (local_5c0 != (undefined1  [8])&local_5b0) {
        operator_delete((void *)local_5c0,(ulong)(local_5b0._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_5e8 != &local_5d8) {
        operator_delete(_local_5e8,(ulong)(local_5d8._M_allocated_capacity + 1));
      }
      bVar19 = false;
      goto LAB_0060aff9;
    }
  }
  poVar3 = (ostringstream *)(local_1e8 + 8);
  local_1e8._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar3,"No invalid pixels found.",0x18);
  MessageBuilder::operator<<((MessageBuilder *)local_1e8,(EndMessageToken *)&TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_170);
  local_1e8._0_4_ = S;
  local_1e8._4_4_ = SNORM_INT8;
  local_518.m_name._M_dataplus._M_p = (undefined1 *)((long)&local_518 + 0x10U);
  local_518.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_518,(ulong)local_1e8);
  local_518.m_name.field_2._M_allocated_capacity = local_1e8._0_8_;
  builtin_strncpy(local_518.m_name._M_dataplus._M_p,"Verification result",0x13);
  local_518.m_name._M_string_length = local_1e8._0_8_;
  local_518.m_name._M_dataplus._M_p[local_1e8._0_8_] = '\0';
  local_1e8._0_4_ = S;
  local_1e8._4_4_ = SNORM_INT8;
  _local_5e8 = (pointer)&local_5d8;
  _local_5e8 = (pointer)std::__cxx11::string::_M_create((ulong *)local_5e8,(ulong)local_1e8);
  local_5d8._M_allocated_capacity = local_1e8._0_8_;
  *(undefined8 *)_local_5e8 = 0x6f20746c75736552;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_5e8 + 8) = 'f';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_5e8 + 9) = ' ';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_5e8 + 10) = 'r';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_5e8 + 0xb) = 'e';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_5e8 + 0xc) = 'n';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_5e8 + 0xd) = 'd';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_5e8 + 0xe) = 'e';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_5e8 + 0xf) = 'r';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_5e8 + 0xf) = 'r';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_5e8 + 0x10) = 'i';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_5e8 + 0x11) = 'n';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_5e8 + 0x12) = 'g';
  TStack_5e0.order = local_1e8._0_4_;
  TStack_5e0.type = local_1e8._4_4_;
  _local_5e8[local_1e8._0_8_] = '\0';
  LogImageSet::LogImageSet((LogImageSet *)local_328,&local_518.m_name,(string *)local_5e8);
  TestLog::startImageSet(log,(char *)local_328,local_308._M_p);
  local_5b8.order = RA;
  local_5b8.type = SNORM_INT8;
  local_5b0._M_allocated_capacity._0_7_ = 0x746c75736552;
  local_5a0.field_2._M_allocated_capacity._0_4_ = 0x75736552;
  local_5a0.field_2._M_allocated_capacity._4_2_ = 0x746c;
  local_5a0._M_string_length = 6;
  local_5a0.field_2._M_local_buf[6] = '\0';
  local_5c0 = (undefined1  [8])&local_5b0;
  local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
  LogImage::LogImage((LogImage *)local_1e8,(string *)local_5c0,&local_5a0,surface,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
  LogImage::write((LogImage *)local_1e8,__fd,__buf_01,(size_t)surface);
  TestLog::endImageSet(log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Stack_1c8._M_p != aaStack_1b8) {
    operator_delete(_Stack_1c8._M_p,aaStack_1b8[0]._M_allocated_capacity + 1);
  }
  if (local_1e8._0_8_ != (long)local_1e8 + 0x10) {
    operator_delete((void *)local_1e8._0_8_,
                    CONCAT44(aStack_1d8._M_allocated_capacity._4_4_,
                             aStack_1d8._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
    operator_delete(local_5a0._M_dataplus._M_p,
                    CONCAT17(local_5a0.field_2._M_local_buf[7],
                             CONCAT16(local_5a0.field_2._M_local_buf[6],
                                      CONCAT24(local_5a0.field_2._M_allocated_capacity._4_2_,
                                               local_5a0.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  if (local_5c0 != (undefined1  [8])&local_5b0) {
    operator_delete((void *)local_5c0,(ulong)(local_5b0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_p != local_2f8) {
    operator_delete(local_308._M_p,local_2f8[0]._M_allocated_capacity + 1);
  }
  if (local_328 != (undefined1  [8])local_318) {
    operator_delete((void *)local_328,CONCAT44(local_318._4_4_,local_318._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_local_5e8 != &local_5d8) {
    operator_delete(_local_5e8,(ulong)(local_5d8._M_allocated_capacity + 1));
  }
  if (local_518.m_name._M_dataplus._M_p != (undefined1 *)((long)&local_518 + 0x10U)) {
    operator_delete(local_518.m_name._M_dataplus._M_p,
                    local_518.m_name.field_2._M_allocated_capacity + 1);
  }
  bVar19 = true;
LAB_0060aff9:
  Surface::~Surface(&local_558);
  if (local_618.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_618.
                    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_618.
                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_618.
                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar19;
}

Assistant:

bool verifyMultisampleLineGroupInterpolation (const tcu::Surface& surface, const LineSceneSpec& scene, const RasterizationArguments& args, tcu::TestLog& log)
{
	// Multisampled line == 2 triangles

	const tcu::Vec2		viewportSize	= tcu::Vec2((float)surface.getWidth(), (float)surface.getHeight());
	const float			halfLineWidth	= scene.lineWidth * 0.5f;
	TriangleSceneSpec	triangleScene;

	triangleScene.triangles.resize(2 * scene.lines.size());
	for (int lineNdx = 0; lineNdx < (int)scene.lines.size(); ++lineNdx)
	{
		// Transform to screen space, add pixel offsets, convert back to normalized device space, and test as triangles
		const tcu::Vec2 lineNormalizedDeviceSpace[2] =
		{
			tcu::Vec2(scene.lines[lineNdx].positions[0].x() / scene.lines[lineNdx].positions[0].w(), scene.lines[lineNdx].positions[0].y() / scene.lines[lineNdx].positions[0].w()),
			tcu::Vec2(scene.lines[lineNdx].positions[1].x() / scene.lines[lineNdx].positions[1].w(), scene.lines[lineNdx].positions[1].y() / scene.lines[lineNdx].positions[1].w()),
		};
		const tcu::Vec2 lineScreenSpace[2] =
		{
			(lineNormalizedDeviceSpace[0] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * viewportSize,
			(lineNormalizedDeviceSpace[1] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * viewportSize,
		};

		const tcu::Vec2 lineDir			= tcu::normalize(lineScreenSpace[1] - lineScreenSpace[0]);
		const tcu::Vec2 lineNormalDir	= tcu::Vec2(lineDir.y(), -lineDir.x());

		const tcu::Vec2 lineQuadScreenSpace[4] =
		{
			lineScreenSpace[0] + lineNormalDir * halfLineWidth,
			lineScreenSpace[0] - lineNormalDir * halfLineWidth,
			lineScreenSpace[1] - lineNormalDir * halfLineWidth,
			lineScreenSpace[1] + lineNormalDir * halfLineWidth,
		};
		const tcu::Vec2 lineQuadNormalizedDeviceSpace[4] =
		{
			lineQuadScreenSpace[0] / viewportSize * 2.0f - tcu::Vec2(1.0f, 1.0f),
			lineQuadScreenSpace[1] / viewportSize * 2.0f - tcu::Vec2(1.0f, 1.0f),
			lineQuadScreenSpace[2] / viewportSize * 2.0f - tcu::Vec2(1.0f, 1.0f),
			lineQuadScreenSpace[3] / viewportSize * 2.0f - tcu::Vec2(1.0f, 1.0f),
		};

		triangleScene.triangles[lineNdx*2 + 0].positions[0] = tcu::Vec4(lineQuadNormalizedDeviceSpace[0].x(), lineQuadNormalizedDeviceSpace[0].y(), 0.0f, 1.0f);
		triangleScene.triangles[lineNdx*2 + 0].positions[1] = tcu::Vec4(lineQuadNormalizedDeviceSpace[1].x(), lineQuadNormalizedDeviceSpace[1].y(), 0.0f, 1.0f);
		triangleScene.triangles[lineNdx*2 + 0].positions[2] = tcu::Vec4(lineQuadNormalizedDeviceSpace[2].x(), lineQuadNormalizedDeviceSpace[2].y(), 0.0f, 1.0f);

		triangleScene.triangles[lineNdx*2 + 0].sharedEdge[0] = false;
		triangleScene.triangles[lineNdx*2 + 0].sharedEdge[1] = false;
		triangleScene.triangles[lineNdx*2 + 0].sharedEdge[2] = true;

		triangleScene.triangles[lineNdx*2 + 0].colors[0] = scene.lines[lineNdx].colors[0];
		triangleScene.triangles[lineNdx*2 + 0].colors[1] = scene.lines[lineNdx].colors[0];
		triangleScene.triangles[lineNdx*2 + 0].colors[2] = scene.lines[lineNdx].colors[1];

		triangleScene.triangles[lineNdx*2 + 1].positions[0] = tcu::Vec4(lineQuadNormalizedDeviceSpace[0].x(), lineQuadNormalizedDeviceSpace[0].y(), 0.0f, 1.0f);
		triangleScene.triangles[lineNdx*2 + 1].positions[1] = tcu::Vec4(lineQuadNormalizedDeviceSpace[2].x(), lineQuadNormalizedDeviceSpace[2].y(), 0.0f, 1.0f);
		triangleScene.triangles[lineNdx*2 + 1].positions[2] = tcu::Vec4(lineQuadNormalizedDeviceSpace[3].x(), lineQuadNormalizedDeviceSpace[3].y(), 0.0f, 1.0f);

		triangleScene.triangles[lineNdx*2 + 1].sharedEdge[0] = true;
		triangleScene.triangles[lineNdx*2 + 1].sharedEdge[1] = false;
		triangleScene.triangles[lineNdx*2 + 1].sharedEdge[2] = false;

		triangleScene.triangles[lineNdx*2 + 1].colors[0] = scene.lines[lineNdx].colors[0];
		triangleScene.triangles[lineNdx*2 + 1].colors[1] = scene.lines[lineNdx].colors[1];
		triangleScene.triangles[lineNdx*2 + 1].colors[2] = scene.lines[lineNdx].colors[1];
	}

	return verifyTriangleGroupInterpolationWithInterpolator(surface, triangleScene, args, log, MultisampleLineInterpolator(scene));
}